

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O0

bool duckdb::
     ExtractFunctionData<duckdb::AggregateFunctionCatalogEntry,duckdb::AggregateFunctionExtractor>
               (FunctionEntry *entry,idx_t function_idx,DataChunk *output,idx_t output_offset)

{
  bool bVar1;
  __type _Var2;
  string *psVar3;
  AggregateFunctionCatalogEntry *entry_00;
  ulong uVar4;
  FunctionDescription *pFVar5;
  FunctionDescription *pFVar6;
  AggregateFunctionCatalogEntry *in_RCX;
  AggregateFunctionCatalogEntry *in_RDX;
  long in_RSI;
  byte bVar7;
  idx_t col;
  FunctionDescription function_description;
  optional_idx description_idx;
  Value parameter_types_value;
  vector<duckdb::LogicalType,_true> parameter_types_vector;
  AggregateFunctionCatalogEntry *function;
  undefined7 in_stack_fffffffffffff708;
  undefined1 in_stack_fffffffffffff70f;
  CatalogEntry *in_stack_fffffffffffff710;
  LogicalType *in_stack_fffffffffffff718;
  DataChunk *in_stack_fffffffffffff720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff728;
  LogicalTypeId id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff730;
  FunctionDescription *in_stack_fffffffffffff738;
  FunctionDescription *in_stack_fffffffffffff740;
  AggregateFunctionCatalogEntry *in_stack_fffffffffffff748;
  optional_idx *in_stack_fffffffffffff750;
  string *in_stack_fffffffffffff788;
  Value *in_stack_fffffffffffff790;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff7c0;
  vector<duckdb::FunctionDescription,_true> *in_stack_fffffffffffff7c8;
  AggregateFunctionCatalogEntry *pAVar8;
  AggregateFunctionCatalogEntry *pAVar9;
  AggregateFunctionCatalogEntry *parameter_types;
  AggregateFunctionCatalogEntry *function_idx_00;
  AggregateFunctionCatalogEntry *entry_01;
  idx_t in_stack_fffffffffffff850;
  AggregateFunctionCatalogEntry *in_stack_fffffffffffff858;
  AggregateFunctionCatalogEntry *entry_02;
  AggregateFunctionCatalogEntry *offset;
  idx_t in_stack_fffffffffffff8e0;
  AggregateFunctionCatalogEntry *in_stack_fffffffffffff8e8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffa28;
  bool local_3c9;
  string local_3c8 [39];
  byte local_3a1;
  byte local_301;
  string local_300 [39];
  byte local_2d9;
  string local_280 [96];
  string local_220 [160];
  string local_180 [96];
  FunctionDescription *local_120;
  undefined1 local_118 [48];
  string local_e8 [80];
  optional_idx local_98 [14];
  AggregateFunctionCatalogEntry *local_28;
  AggregateFunctionCatalogEntry *local_20;
  AggregateFunctionCatalogEntry *local_18;
  long local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = CatalogEntry::Cast<duckdb::AggregateFunctionCatalogEntry>(in_stack_fffffffffffff710);
  AggregateFunctionExtractor::GetParameterLogicalTypes
            (in_stack_fffffffffffff858,in_stack_fffffffffffff850);
  AggregateFunctionExtractor::GetParameterTypes(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0)
  ;
  local_98[0] = GetFunctionDescriptionIndex(in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
  bVar1 = optional_idx::IsValid(local_98);
  if (bVar1) {
    optional_idx::GetIndex(in_stack_fffffffffffff750);
    vector<duckdb::FunctionDescription,_true>::operator[]
              ((vector<duckdb::FunctionDescription,_true> *)in_stack_fffffffffffff710,
               CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
    FunctionDescription::FunctionDescription(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  }
  else {
    memset(local_118,0,0x80);
    FunctionDescription::FunctionDescription((FunctionDescription *)in_stack_fffffffffffff710);
  }
  local_120 = (FunctionDescription *)0x1;
  psVar3 = Catalog::GetName_abi_cxx11_((Catalog *)0x1434349);
  ::std::__cxx11::string::string(local_180,(string *)psVar3);
  Value::Value(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  ::std::__cxx11::string::~string(local_180);
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  Catalog::GetOid((Catalog *)0x1434418);
  entry_00 = (AggregateFunctionCatalogEntry *)NumericCast<long,unsigned_long,void>(0x143442f);
  Value::BIGINT((int64_t)in_stack_fffffffffffff748);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  offset = local_20;
  ::std::__cxx11::string::string
            (local_220,
             (string *)
             &(((local_28->super_FunctionEntry).super_StandardEntry.schema)->super_InCatalogEntry).
              super_CatalogEntry.name);
  Value::Value(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  ::std::__cxx11::string::~string(local_220);
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  pAVar9 = local_18;
  ::std::__cxx11::string::string
            (local_280,
             (string *)
             &(local_28->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry.name);
  Value::Value(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  ::std::__cxx11::string::~string(local_280);
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  pAVar8 = local_20;
  uVar4 = ::std::__cxx11::string::empty();
  local_2d9 = 0;
  local_301 = 0;
  if ((uVar4 & 1) == 0) {
    _Var2 = ::std::operator==(in_stack_fffffffffffff730,in_stack_fffffffffffff728);
    id = (LogicalTypeId)((ulong)in_stack_fffffffffffff728 >> 0x38);
    if (!_Var2) {
      ::std::__cxx11::string::string(local_300,(string *)&(local_28->super_FunctionEntry).alias_of);
      local_301 = 1;
      Value::Value(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
      goto LAB_014346e5;
    }
  }
  id = (LogicalTypeId)((ulong)in_stack_fffffffffffff728 >> 0x38);
  LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffff730,id);
  local_2d9 = 1;
  Value::Value((Value *)in_stack_fffffffffffff720,in_stack_fffffffffffff718);
LAB_014346e5:
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  if ((local_301 & 1) != 0) {
    ::std::__cxx11::string::~string(local_300);
  }
  if ((local_2d9 & 1) != 0) {
    LogicalType::~LogicalType((LogicalType *)0x143474b);
  }
  pFVar5 = local_120;
  entry_02 = local_20;
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  AggregateFunctionExtractor::GetFunctionType();
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  uVar4 = ::std::__cxx11::string::empty();
  local_3a1 = 0;
  local_3c9 = (uVar4 & 1) != 0;
  if (local_3c9) {
    LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffff730,id);
    local_3a1 = 1;
    Value::Value((Value *)in_stack_fffffffffffff720,in_stack_fffffffffffff718);
  }
  else {
    ::std::__cxx11::string::string(local_3c8,local_e8);
    Value::Value(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  }
  local_3c9 = !local_3c9;
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  if (local_3c9) {
    ::std::__cxx11::string::~string(local_3c8);
  }
  if ((local_3a1 & 1) != 0) {
    LogicalType::~LogicalType((LogicalType *)0x14348ff);
  }
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  entry_01 = local_18;
  Value::MAP(in_stack_fffffffffffffa28);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  parameter_types = local_18;
  pFVar6 = local_120;
  function_idx_00 = local_20;
  local_120 = (FunctionDescription *)
              ((long)&(local_120->parameter_types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1);
  AggregateFunctionExtractor::GetReturnType(pAVar9,(idx_t)pAVar8);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  pAVar9 = local_18;
  GetParameterNames<duckdb::AggregateFunctionCatalogEntry,duckdb::AggregateFunctionExtractor>
            (&entry_01->super_FunctionEntry,(idx_t)function_idx_00,pFVar6,(Value *)parameter_types);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  pAVar8 = local_20;
  AggregateFunctionExtractor::GetVarArgs(entry_00,(idx_t)offset);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  AggregateFunctionExtractor::GetMacroDefinition
            (in_stack_fffffffffffff748,(idx_t)in_stack_fffffffffffff740);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  pFVar6 = local_120;
  local_120 = (FunctionDescription *)
              ((long)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_120->parameter_types)->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1);
  AggregateFunctionExtractor::IsVolatile(entry_02,(idx_t)pFVar5);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  Value::BOOLEAN(SUB81((ulong)in_stack_fffffffffffff748 >> 0x38,0));
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  NumericCast<long,unsigned_long,void>(0x1434da0);
  Value::BIGINT((int64_t)in_stack_fffffffffffff748);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffff730,id);
  ToValueVector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)pFVar6);
  Value::LIST((LogicalType *)pAVar9,(vector<duckdb::Value,_true> *)pAVar8);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1434e9a);
  LogicalType::~LogicalType((LogicalType *)0x1434ea7);
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  AggregateFunctionExtractor::ResultType(entry_02,(idx_t)pFVar5);
  DataChunk::SetValue(in_stack_fffffffffffff720,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  uVar4 = (ulong)local_120 >> 0x38;
  local_120 = (FunctionDescription *)((long)local_120 + 1);
  LogicalType::LogicalType((LogicalType *)local_20,(LogicalTypeId)uVar4);
  ToValueVector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)pFVar6);
  Value::LIST((LogicalType *)pAVar9,(vector<duckdb::Value,_true> *)pAVar8);
  DataChunk::SetValue((DataChunk *)local_18,(idx_t)in_stack_fffffffffffff718,
                      (idx_t)in_stack_fffffffffffff710,
                      (Value *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
  Value::~Value((Value *)in_stack_fffffffffffff710);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1434fd7);
  LogicalType::~LogicalType((LogicalType *)0x1434fe4);
  pFVar5 = (FunctionDescription *)(local_10 + 1);
  pFVar6 = (FunctionDescription *)
           AggregateFunctionExtractor::FunctionCount((AggregateFunctionCatalogEntry *)0x1435001);
  bVar7 = pFVar5 == pFVar6;
  FunctionDescription::~FunctionDescription(pFVar5);
  Value::~Value((Value *)pFVar5);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1435043);
  return (bool)(bVar7 & 1);
}

Assistant:

bool ExtractFunctionData(FunctionEntry &entry, idx_t function_idx, DataChunk &output, idx_t output_offset) {
	auto &function = entry.Cast<T>();
	vector<LogicalType> parameter_types_vector = OP::GetParameterLogicalTypes(function, function_idx);
	Value parameter_types_value = OP::GetParameterTypes(function, function_idx);
	optional_idx description_idx = GetFunctionDescriptionIndex(entry.descriptions, parameter_types_vector);
	FunctionDescription function_description =
	    description_idx.IsValid() ? entry.descriptions[description_idx.GetIndex()] : FunctionDescription();

	idx_t col = 0;

	// database_name, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(function.schema.catalog.GetName()));

	// database_oid, BIGINT
	output.SetValue(col++, output_offset, Value::BIGINT(NumericCast<int64_t>(function.schema.catalog.GetOid())));

	// schema_name, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(function.schema.name));

	// function_name, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(function.name));

	// alias_of, LogicalType::VARCHAR
	output.SetValue(col++, output_offset,
	                function.alias_of.empty() || function.alias_of == function.name ? Value()
	                                                                                : Value(function.alias_of));

	// function_type, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, Value(OP::GetFunctionType()));

	// function_description, LogicalType::VARCHAR
	output.SetValue(col++, output_offset,
	                (function_description.description.empty()) ? Value() : Value(function_description.description));

	// comment, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, entry.comment);

	// tags, LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR)
	output.SetValue(col++, output_offset, Value::MAP(entry.tags));

	// return_type, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::GetReturnType(function, function_idx));

	// parameters, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset,
	                GetParameterNames<T, OP>(function, function_idx, function_description, parameter_types_value));

	// parameter_types, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset, parameter_types_value);

	// varargs, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::GetVarArgs(function, function_idx));

	// macro_definition, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::GetMacroDefinition(function, function_idx));

	// has_side_effects, LogicalType::BOOLEAN
	output.SetValue(col++, output_offset, OP::IsVolatile(function, function_idx));

	// internal, LogicalType::BOOLEAN
	output.SetValue(col++, output_offset, Value::BOOLEAN(function.internal));

	// function_oid, LogicalType::BIGINT
	output.SetValue(col++, output_offset, Value::BIGINT(NumericCast<int64_t>(function.oid)));

	// examples, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset,
	                Value::LIST(LogicalType::VARCHAR, ToValueVector(function_description.examples)));

	// stability, LogicalType::VARCHAR
	output.SetValue(col++, output_offset, OP::ResultType(function, function_idx));

	// categories, LogicalType::LIST(LogicalType::VARCHAR)
	output.SetValue(col++, output_offset,
	                Value::LIST(LogicalType::VARCHAR, ToValueVector(function_description.categories)));

	return function_idx + 1 == OP::FunctionCount(function);
}